

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_palette_colors_y(MACROBLOCKD *xd,PALETTE_MODE_INFO *pmi,int bit_depth,aom_writer *w)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int n_colors;
  long in_RSI;
  int found;
  int i;
  int n_in_cache;
  int n_out_cache;
  uint8_t cache_color_found [16];
  int out_cache_colors [8];
  int n_cache;
  uint16_t color_cache [16];
  int n;
  int in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  int local_94;
  int local_90;
  byte local_88 [40];
  int *in_stack_ffffffffffffffa0;
  aom_writer *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  MACROBLOCKD *in_stack_ffffffffffffffc8;
  
  bVar1 = *(byte *)(in_RSI + 0x30);
  n_colors = av1_get_palette_cache
                       (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                        (uint16_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  av1_index_color_cache
            ((uint16_t *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             (uint16_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),n_colors,
             (uint8_t *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_90 = 0;
  for (local_94 = 0; bVar3 = local_90 < (int)(uint)bVar1, local_94 < n_colors && bVar3;
      local_94 = local_94 + 1) {
    bVar2 = local_88[local_94];
    aom_write_bit((aom_writer *)CONCAT17(local_94 < n_colors && bVar3,in_stack_ffffffffffffff60),
                  in_stack_ffffffffffffff5c);
    local_90 = (uint)bVar2 + local_90;
  }
  delta_encode_palette_colors
            ((int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,n_colors,in_stack_ffffffffffffffa8)
  ;
  return;
}

Assistant:

static inline void write_palette_colors_y(const MACROBLOCKD *const xd,
                                          const PALETTE_MODE_INFO *const pmi,
                                          int bit_depth, aom_writer *w) {
  const int n = pmi->palette_size[0];
  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 0, color_cache);
  int out_cache_colors[PALETTE_MAX_SIZE];
  uint8_t cache_color_found[2 * PALETTE_MAX_SIZE];
  const int n_out_cache =
      av1_index_color_cache(color_cache, n_cache, pmi->palette_colors, n,
                            cache_color_found, out_cache_colors);
  int n_in_cache = 0;
  for (int i = 0; i < n_cache && n_in_cache < n; ++i) {
    const int found = cache_color_found[i];
    aom_write_bit(w, found);
    n_in_cache += found;
  }
  assert(n_in_cache + n_out_cache == n);
  delta_encode_palette_colors(out_cache_colors, n_out_cache, bit_depth, 1, w);
}